

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::VisionFeaturePrint
          (VisionFeaturePrint *this,VisionFeaturePrint *from)

{
  void *pvVar1;
  VisionFeaturePrint_Objects *this_00;
  VisionFeaturePrint_Scene *this_01;
  VisionFeaturePrint_Objects *from_00;
  VisionFeaturePrint_Scene *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__VisionFeaturePrint_003dc000;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x14) {
    clear_VisionFeaturePrintType(this);
    this->_oneof_case_[0] = 0x14;
    this_01 = (VisionFeaturePrint_Scene *)operator_new(0x18);
    VisionFeaturePrint_Scene::VisionFeaturePrint_Scene(this_01);
    (this->VisionFeaturePrintType_).scene_ = this_01;
    if (from->_oneof_case_[0] == 0x14) {
      from_01 = (from->VisionFeaturePrintType_).scene_;
    }
    else {
      protobuf_VisionFeaturePrint_2eproto::InitDefaults();
      from_01 = (VisionFeaturePrint_Scene *)&_VisionFeaturePrint_Scene_default_instance_;
    }
    VisionFeaturePrint_Scene::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0x15) {
    clear_VisionFeaturePrintType(this);
    this->_oneof_case_[0] = 0x15;
    this_00 = (VisionFeaturePrint_Objects *)operator_new(0x30);
    VisionFeaturePrint_Objects::VisionFeaturePrint_Objects(this_00);
    (this->VisionFeaturePrintType_).objects_ = this_00;
    if (from->_oneof_case_[0] == 0x15) {
      from_00 = (from->VisionFeaturePrintType_).objects_;
    }
    else {
      protobuf_VisionFeaturePrint_2eproto::InitDefaults();
      from_00 = (VisionFeaturePrint_Objects *)&_VisionFeaturePrint_Objects_default_instance_;
    }
    VisionFeaturePrint_Objects::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

VisionFeaturePrint::VisionFeaturePrint(const VisionFeaturePrint& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_VisionFeaturePrintType();
  switch (from.VisionFeaturePrintType_case()) {
    case kScene: {
      mutable_scene()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::MergeFrom(from.scene());
      break;
    }
    case kObjects: {
      mutable_objects()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::MergeFrom(from.objects());
      break;
    }
    case VISIONFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
}